

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoelrefpattern.h.h
# Opt level: O2

void __thiscall
TPZGeoElRefPattern<pzgeom::TPZArc3D>::TPZGeoElRefPattern(TPZGeoElRefPattern<pzgeom::TPZArc3D> *this)

{
  *(undefined ***)&(this->super_TPZGeoElRefLess<pzgeom::TPZArc3D>).super_TPZGeoEl =
       &PTR__TPZSavable_016e2910;
  TPZGeoElRefLess<pzgeom::TPZArc3D>::TPZGeoElRefLess
            (&this->super_TPZGeoElRefLess<pzgeom::TPZArc3D>,&PTR_PTR_016e21e8);
  *(undefined ***)&(this->super_TPZGeoElRefLess<pzgeom::TPZArc3D>).super_TPZGeoEl =
       &PTR__TPZGeoElRefPattern_016e1ee8;
  TPZVec<long>::TPZVec(&this->fSubEl,0);
  TPZAutoPointer<TPZRefPattern>::TPZAutoPointer(&this->fRefPattern,(TPZRefPattern *)0x0);
  return;
}

Assistant:

TPZGeoElRefPattern<TGeo>::TPZGeoElRefPattern():TPZRegisterClassId(&TPZGeoElRefPattern<TGeo>::ClassId),
TPZGeoElRefLess<TGeo>(), fSubEl(0), fRefPattern(0)
{
}